

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> * __thiscall
libtorrent::bdecode_node::dict_at
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
           *__return_storage_ptr__,bdecode_node *this,int i)

{
  string_view sVar1;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> pStack_98;
  
  dict_at_node(&pStack_98,this,i);
  sVar1 = string_value(&pStack_98.first);
  (__return_storage_ptr__->first)._M_len = sVar1._M_len;
  (__return_storage_ptr__->first)._M_str = sVar1._M_str;
  bdecode_node(&__return_storage_ptr__->second,&pStack_98.second);
  ::std::pair<libtorrent::bdecode_node,_libtorrent::bdecode_node>::~pair(&pStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, bdecode_node> bdecode_node::dict_at(int const i) const
	{
		auto const [key, value] = dict_at_node(i);
		return {key.string_value(), value};
	}